

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlSAXParseEntity(xmlSAXHandlerPtr sax,char *filename)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  char *filename_local;
  xmlSAXHandlerPtr sax_local;
  
  ctxt_00 = xmlCreateFileParserCtxt(filename);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      if (sax->initialized == 0xdeedbeaf) {
        memcpy(ctxt_00->sax,sax,0x100);
      }
      else {
        memset(ctxt_00->sax,0,0x100);
        memcpy(ctxt_00->sax,sax,0xe0);
      }
      ctxt_00->userData = (void *)0x0;
    }
    xmlParseExtParsedEnt(ctxt_00);
    if (ctxt_00->wellFormed == 0) {
      ctxt = (xmlParserCtxtPtr)0x0;
      xmlFreeDoc(ctxt_00->myDoc);
    }
    else {
      ctxt = (xmlParserCtxtPtr)ctxt_00->myDoc;
    }
    xmlFreeParserCtxt(ctxt_00);
    sax_local = (xmlSAXHandlerPtr)ctxt;
  }
  return (xmlDocPtr)sax_local;
}

Assistant:

xmlDocPtr
xmlSAXParseEntity(xmlSAXHandlerPtr sax, const char *filename) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) {
	return(NULL);
    }
    if (sax != NULL) {
        if (sax->initialized == XML_SAX2_MAGIC) {
            *ctxt->sax = *sax;
        } else {
            memset(ctxt->sax, 0, sizeof(*ctxt->sax));
            memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
        ctxt->userData = NULL;
    }

    xmlParseExtParsedEnt(ctxt);

    if (ctxt->wellFormed) {
	ret = ctxt->myDoc;
    } else {
        ret = NULL;
        xmlFreeDoc(ctxt->myDoc);
    }

    xmlFreeParserCtxt(ctxt);

    return(ret);
}